

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unload.c
# Opt level: O0

void unload_duh(DUH *duh)

{
  void *in_RDI;
  int i;
  undefined4 local_c;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0x18) != 0) {
      for (local_c = 0; local_c < *(int *)((long)in_RDI + 0x10); local_c = local_c + 1) {
        destroy_signal((DUH_SIGNAL *)0x83cb4e);
      }
      free(*(void **)((long)in_RDI + 0x18));
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      if (**(long **)((long)in_RDI + 8) != 0) {
        free((void *)**(undefined8 **)((long)in_RDI + 8));
      }
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void DUMBEXPORT unload_duh(DUH *duh)
{
	int i;

	if (duh) {
		if (duh->signal) {
			for (i = 0; i < duh->n_signals; i++)
				destroy_signal(duh->signal[i]);

			free(duh->signal);
		}

		if (duh->tag) {
			if (duh->tag[0][0])
				free(duh->tag[0][0]);
			free(duh->tag);
		}

		free(duh);
	}
}